

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void bssl::internal::DeleterImpl<stack_st_CRYPTO_BUFFER,_void>::Free(stack_st_CRYPTO_BUFFER *sk)

{
  _func_void_OPENSSL_sk_free_func_void_ptr *call_free_func;
  _lambda_void____void___void___1_ local_11;
  stack_st_CRYPTO_BUFFER *local_10;
  stack_st_CRYPTO_BUFFER *sk_local;
  
  local_10 = sk;
  call_free_func =
       DeleterImpl::Free(stack_st_CRYPTO_BUFFER*)::{lambda(void(*)(void*),void*)#1}::
       operator_cast_to_function_pointer(&local_11);
  OPENSSL_sk_pop_free_ex((OPENSSL_STACK *)sk,call_free_func,(OPENSSL_sk_free_func)0x0);
  return;
}

Assistant:

static void Free(Stack *sk) {
    // sk_FOO_pop_free is defined by macros and bound by name, so we cannot
    // access it from C++ here.
    using Type = typename StackTraits<Stack>::Type;
    OPENSSL_sk_pop_free_ex(
        reinterpret_cast<OPENSSL_STACK *>(sk),
        [](OPENSSL_sk_free_func /* unused */, void *ptr) {
          DeleterImpl<Type>::Free(reinterpret_cast<Type *>(ptr));
        },
        nullptr);
  }